

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpaintengine.cpp
# Opt level: O0

void __thiscall
QOpenGL2PaintEngineExPrivate::stroke(QOpenGL2PaintEngineExPrivate *this,QVectorPath *path,QPen *pen)

{
  PenStyle PVar1;
  uint uVar2;
  int iVar3;
  QOpenGL2PaintEngineState *pQVar4;
  QOpenGL2PaintEngineState *pQVar5;
  qreal *points;
  ElementType *elements;
  float *pfVar6;
  double *pdVar7;
  ulong uVar8;
  QOpenGL2PaintEngineExPrivate *this_00;
  QRectF *in_RDX;
  QPen *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  qreal qVar9;
  int *stops;
  qreal extra;
  bool opaque;
  QBrush *penBrush;
  PenStyle penStyle;
  QOpenGL2PaintEngineState *s;
  QRectF bounds;
  qreal width;
  QVectorPath dashStroke;
  QRectF clip;
  GLint in_stack_fffffffffffffe18;
  GLenum zfail;
  GLuint in_stack_fffffffffffffe1c;
  QOpenGLFunctions *in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  GLuint in_stack_fffffffffffffe2c;
  QRectF *in_stack_fffffffffffffe30;
  int *yp1;
  qreal in_stack_fffffffffffffe38;
  undefined1 srcPixelsAreOpaque;
  QOpenGL2PaintEngineExPrivate *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe50;
  uint in_stack_fffffffffffffe54;
  uint uVar10;
  int stopCount;
  undefined4 in_stack_fffffffffffffe6c;
  QBrush *data;
  undefined4 in_stack_fffffffffffffe78;
  StencilFillMode in_stack_fffffffffffffea0;
  QOpenGL2PaintEngineExPrivate *in_stack_fffffffffffffea8;
  double local_100;
  int *local_f8;
  undefined4 local_ec;
  QVectorPath local_e8;
  undefined4 local_a8;
  undefined4 local_a4;
  QRectF local_a0;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  QBrush local_60 [8];
  bool local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x161787);
  if ((*(byte *)(in_RDI + 0x3c0) & 1) != 0) {
    *(undefined1 *)(in_RDI + 0x3c0) = 0;
    *(undefined1 *)(in_RDI + 0x263) = 1;
  }
  PVar1 = qpen_style((QPen *)0x1617ba);
  qpen_brush((QPen *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  data = local_60;
  uVar2 = QBrush::isOpaque();
  uVar10 = in_stack_fffffffffffffe54 & 0xffffff;
  if ((uVar2 & 1) != 0) {
    uVar10 = CONCAT13(0.99 < *(double *)&pQVar4->field_0x198,(int3)in_stack_fffffffffffffe54);
  }
  uVar2 = CONCAT13((char)(uVar10 >> 0x18),(int3)in_stack_fffffffffffffe6c);
  transferMode(in_stack_fffffffffffffe40,(EngineMode)((ulong)in_stack_fffffffffffffe38 >> 0x20));
  updateMatrix(in_stack_fffffffffffffea8);
  local_80 = 0xffffffffffffffff;
  local_78 = 0xffffffffffffffff;
  local_70 = 0xffffffffffffffff;
  local_68 = 0xffffffffffffffff;
  QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x161895);
  QTransform::inverted(local_58);
  pQVar5 = QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x1618c1);
  if (((byte)pQVar5->field_0x1a0 >> 2 & 1) == 0) {
    QRectF::QRectF(&local_a0,0.0,0.0,(double)*(int *)(in_RDI + 0x240),
                   (double)*(int *)(in_RDI + 0x244));
  }
  else {
    QOpenGL2PaintEngineEx::state((QOpenGL2PaintEngineEx *)0x1618e5);
    QRectF::QRectF(in_stack_fffffffffffffe30,
                   (QRect *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  }
  QTransform::mapRect((QRectF *)&local_80);
  if (PVar1 == SolidLine) {
    local_a4 = *(undefined4 *)&pQVar4->field_0x6c;
    QTriangulatingStroker::process
              ((QVectorPath *)(in_RDI + 0x430),in_RSI,in_RDX,(QFlags_conflict *)&local_80);
  }
  else {
    local_a8 = *(undefined4 *)&pQVar4->field_0x6c;
    QDashedStrokeProcessor::process
              ((QVectorPath *)(in_RDI + 0x498),in_RSI,in_RDX,(QFlags_conflict *)&local_80);
    memcpy(&local_e8,&DAT_001de7c8,0x40);
    points = QDashedStrokeProcessor::points((QDashedStrokeProcessor *)0x1619ed);
    in_stack_fffffffffffffe50 =
         QDashedStrokeProcessor::elementCount((QDashedStrokeProcessor *)0x161a03);
    elements = QDashedStrokeProcessor::elementTypes((QDashedStrokeProcessor *)0x161a18);
    QVectorPath::QVectorPath(&local_e8,points,in_stack_fffffffffffffe50,elements,7);
    local_ec = *(undefined4 *)&pQVar4->field_0x6c;
    QTriangulatingStroker::process
              ((QVectorPath *)(in_RDI + 0x430),(QPen *)&local_e8,in_RDX,(QFlags_conflict *)&local_80
              );
    QVectorPath::~QVectorPath(&local_e8);
  }
  iVar3 = QTriangulatingStroker::vertexCount((QTriangulatingStroker *)0x161a92);
  if (iVar3 != 0) {
    if ((uVar2 & 0x1000000) == 0) {
      qVar9 = qpen_widthf((QPen *)0x161b45);
      local_f8 = (int *)(qVar9 / 2.0);
      if (((double)local_f8 == 0.0) && (!NAN((double)local_f8))) {
        local_f8 = (int *)0x3fe0000000000000;
      }
      iVar3 = QPen::joinStyle();
      yp1 = local_f8;
      if (iVar3 == 0) {
        local_100 = (double)QPen::miterLimit();
        local_100 = local_100 * (double)local_f8;
        pdVar7 = qMax<double>(&local_100,(double *)&local_f8);
        yp1 = (int *)*pdVar7;
      }
      stops = yp1;
      uVar8 = QPen::isCosmetic();
      if ((uVar8 & 1) != 0) {
        stops = (int *)((double)stops * (double)*(float *)(in_RDI + 1000));
      }
      QVectorPath::controlPointRect();
      stopCount = (int)((ulong)in_RDI >> 0x20);
      QRectF::adjusted((QRectF *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,(qreal)yp1,
                       (qreal)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                       (qreal)in_stack_fffffffffffffe20);
      srcPixelsAreOpaque = (undefined1)((ulong)in_stack_fffffffffffffe38 >> 0x38);
      this_00 = (QOpenGL2PaintEngineExPrivate *)
                QTriangulatingStroker::vertices((QTriangulatingStroker *)0x161cd1);
      iVar3 = QTriangulatingStroker::vertexCount((QTriangulatingStroker *)0x161ce7);
      iVar3 = iVar3 / 2;
      QOpenGLRect::QOpenGLRect
                ((QOpenGLRect *)this_00,
                 (QRectF *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
      zfail = 2;
      fillStencilWithVertexArray
                ((QOpenGL2PaintEngineExPrivate *)CONCAT44(PVar1,in_stack_fffffffffffffe78),
                 (float *)data,uVar2,stops,stopCount,
                 (QOpenGLRect *)CONCAT44(uVar10,in_stack_fffffffffffffe50),in_stack_fffffffffffffea0
                );
      QOpenGLFunctions::glStencilOp((QOpenGLFunctions *)this_00,in_stack_fffffffffffffe1c,zfail,0);
      QOpenGLFunctions::glStencilFunc((QOpenGLFunctions *)this_00,in_stack_fffffffffffffe1c,zfail,0)
      ;
      prepareForDraw(in_stack_fffffffffffffe40,(bool)srcPixelsAreOpaque);
      QOpenGLRect::QOpenGLRect
                ((QOpenGLRect *)this_00,(QRectF *)CONCAT44(in_stack_fffffffffffffe1c,zfail));
      composite(this_00,(QOpenGLRect *)CONCAT44(in_stack_fffffffffffffe1c,zfail));
      QOpenGLFunctions::glStencilMask((QOpenGLFunctions *)this_00,in_stack_fffffffffffffe1c);
      updateClipScissorTest
                ((QOpenGL2PaintEngineExPrivate *)CONCAT44(iVar3,in_stack_fffffffffffffe28));
    }
    else {
      prepareForDraw(in_stack_fffffffffffffe40,SUB81((ulong)in_stack_fffffffffffffe38 >> 0x38,0));
      pfVar6 = QTriangulatingStroker::vertices((QTriangulatingStroker *)0x161ad3);
      uVar2 = (uint)((ulong)pfVar6 >> 0x20);
      QTriangulatingStroker::vertexCount((QTriangulatingStroker *)0x161ae9);
      uploadData(in_stack_fffffffffffffe40,uVar2,(GLfloat *)in_stack_fffffffffffffe30,
                 in_stack_fffffffffffffe2c);
      QTriangulatingStroker::vertexCount((QTriangulatingStroker *)0x161b1b);
      QOpenGLFunctions::glDrawArrays
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18,0);
    }
  }
  QBrush::~QBrush(local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QOpenGL2PaintEngineExPrivate::stroke(const QVectorPath &path, const QPen &pen)
{
    const QOpenGL2PaintEngineState *s = q->state();
    if (snapToPixelGrid) {
        snapToPixelGrid = false;
        matrixDirty = true;
    }

    const Qt::PenStyle penStyle = qpen_style(pen);
    const QBrush &penBrush = qpen_brush(pen);
    const bool opaque = penBrush.isOpaque() && s->opacity > 0.99;

    transferMode(BrushDrawingMode);

    // updateMatrix() is responsible for setting the inverse scale on
    // the strokers, so we need to call it here and not wait for
    // prepareForDraw() down below.
    updateMatrix();

    QRectF clip = q->state()->matrix.inverted().mapRect(q->state()->clipEnabled
                                                        ? q->state()->rectangleClip
                                                        : QRectF(0, 0, width, height));

    if (penStyle == Qt::SolidLine) {
        stroker.process(path, pen, clip, s->renderHints);

    } else { // Some sort of dash
        dasher.process(path, pen, clip, s->renderHints);

        QVectorPath dashStroke(dasher.points(),
                               dasher.elementCount(),
                               dasher.elementTypes());
        stroker.process(dashStroke, pen, clip, s->renderHints);
    }

    if (!stroker.vertexCount())
        return;

    if (opaque) {
        prepareForDraw(opaque);

        uploadData(QT_VERTEX_COORDS_ATTR, stroker.vertices(), stroker.vertexCount());
        funcs.glDrawArrays(GL_TRIANGLE_STRIP, 0, stroker.vertexCount() / 2);
    } else {
        qreal width = qpen_widthf(pen) / 2;
        if (width == 0)
            width = 0.5;
        qreal extra = pen.joinStyle() == Qt::MiterJoin
                      ? qMax(pen.miterLimit() * width, width)
                      : width;

        if (pen.isCosmetic())
            extra = extra * inverseScale;

        QRectF bounds = path.controlPointRect().adjusted(-extra, -extra, extra, extra);

        fillStencilWithVertexArray(stroker.vertices(), stroker.vertexCount() / 2,
                                      nullptr, 0, bounds, QOpenGL2PaintEngineExPrivate::TriStripStrokeFillMode);

        funcs.glStencilOp(GL_KEEP, GL_REPLACE, GL_REPLACE);

        // Pass when any bit is set, replace stencil value with 0
        funcs.glStencilFunc(GL_NOTEQUAL, 0, GL_STENCIL_HIGH_BIT);
        prepareForDraw(false);

        // Stencil the brush onto the dest buffer
        composite(bounds);

        funcs.glStencilMask(0);

        updateClipScissorTest();
    }
}